

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit)

{
  uint8_t uVar1;
  uint uVar2;
  roaring_bitmap_t *prVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  long *plVar7;
  
  newit->in_container_index = 0;
  newit->run_index = 0;
  newit->current_value = 0;
  uVar2 = newit->container_index;
  prVar3 = newit->parent;
  bVar4 = (int)uVar2 < (prVar3->high_low_container).size;
  bVar6 = -1 < (int)uVar2 && bVar4;
  if (-1 >= (int)uVar2 || !bVar4) {
    newit->current_value = 0xffffffff;
    newit->has_value = false;
    return bVar6;
  }
  newit->has_value = true;
  plVar7 = (long *)(prVar3->high_low_container).containers[uVar2];
  newit->container = plVar7;
  uVar1 = (prVar3->high_low_container).typecodes[uVar2];
  newit->typecode = uVar1;
  newit->highbits = (uint)(prVar3->high_low_container).keys[uVar2] << 0x10;
  if (uVar1 == '\x04') {
    lVar5 = plVar7[1];
    newit->typecode = (uint8_t)lVar5;
    if ((uint8_t)lVar5 == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    plVar7 = (long *)*plVar7;
  }
  newit->container = plVar7;
  return bVar6;
}

Assistant:

static bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit) {
    newit->in_container_index = 0;
    newit->run_index = 0;
    newit->current_value = 0;
    if (newit->container_index >= newit->parent->high_low_container.size ||
        newit->container_index < 0) {
        newit->current_value = UINT32_MAX;
        return (newit->has_value = false);
    }
    // assume not empty
    newit->has_value = true;
    // we precompute container, typecode and highbits so that successive
    // iterators do not have to grab them from odd memory locations
    // and have to worry about the (easily predicted) container_unwrap_shared
    // call.
    newit->container =
            newit->parent->high_low_container.containers[newit->container_index];
    newit->typecode =
            newit->parent->high_low_container.typecodes[newit->container_index];
    newit->highbits =
            ((uint32_t)
                    newit->parent->high_low_container.keys[newit->container_index])
                    << 16;
    newit->container =
            container_unwrap_shared(newit->container, &(newit->typecode));
    return newit->has_value;
}